

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kernel_svm.cc
# Opt level: O0

int __thiscall svm_example::compute_kernels(svm_example *this,svm_params *params)

{
  undefined8 *puVar1;
  flat_example *pfVar2;
  size_t sVar3;
  svm_example **ppsVar4;
  long in_RSI;
  v_array<float> *in_RDI;
  float kv;
  svm_example *sec;
  size_t i;
  size_t n;
  svm_model *model;
  int alloc;
  undefined4 in_stack_ffffffffffffffc0;
  float in_stack_ffffffffffffffc4;
  flat_example *fec1;
  int local_14;
  
  local_14 = 0;
  puVar1 = *(undefined8 **)(in_RSI + 0x38);
  fec1 = (flat_example *)*puVar1;
  pfVar2 = (flat_example *)v_array<float>::size(in_RDI);
  if (pfVar2 < fec1) {
    sVar3 = v_array<float>::size(in_RDI);
    num_kernel_evals = sVar3 + num_kernel_evals;
    for (pfVar2 = (flat_example *)v_array<float>::size(in_RDI); pfVar2 < fec1;
        pfVar2 = (flat_example *)((long)&(pfVar2->l).cs.costs._begin + 1)) {
      ppsVar4 = v_array<svm_example_*>::operator[]
                          ((v_array<svm_example_*> *)(puVar1 + 1),(size_t)pfVar2);
      in_stack_ffffffffffffffc4 =
           kernel_function(fec1,pfVar2,*ppsVar4,
                           CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
      v_array<float>::push_back
                ((v_array<float> *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                 (float *)in_RDI);
      local_14 = local_14 + 1;
    }
  }
  else {
    num_cache_evals = (long)&fec1->l + num_cache_evals;
  }
  return local_14;
}

Assistant:

int svm_example::compute_kernels(svm_params& params)
{
  int alloc = 0;
  svm_model* model = params.model;
  size_t n = model->num_support;

  if (krow.size() < n)
  {
    // computing new kernel values and caching them
    // if(params->curcache + n > params->maxcache)
    // trim_cache(params);
    num_kernel_evals += krow.size();
    // cerr<<"Kernels ";
    for (size_t i = krow.size(); i < n; i++)
    {
      svm_example* sec = model->support_vec[i];
      float kv = kernel_function(&ex, &(sec->ex), params.kernel_params, params.kernel_type);
      krow.push_back(kv);
      alloc += 1;
      // cerr<<kv<<" ";
    }
    // cerr<<endl;
  }
  else
    num_cache_evals += n;
  return alloc;
}